

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

void find_repeat_new_proc(Am_Object *cmd,Am_Value *new_sel,Am_Value *new_value)

{
  bool bVar1;
  Am_Which_Search_Direction dir;
  Am_Value *pAVar2;
  Am_Object sel_widget;
  Am_Value_List old_sel_list;
  Am_Value_List slots_and_values_used;
  Am_Object local_50;
  Am_Value_List local_48;
  Am_Value local_38;
  Am_Value_List local_28;
  
  pAVar2 = Am_Object::Get(cmd,0x197,0);
  Am_Object::Am_Object(&local_50,pAVar2);
  Am_Value_List::Am_Value_List(&local_48);
  bVar1 = Am_Value::Exists(new_sel);
  if (bVar1) {
    bVar1 = Am_Value_List::Test(new_sel);
    pAVar2 = new_sel;
    if (bVar1) goto LAB_0021618c;
  }
  pAVar2 = Am_Object::Get(&local_50,0x169,0);
LAB_0021618c:
  Am_Value_List::operator=(&local_48,pAVar2);
  Am_Value::Am_Value(&local_38,new_sel);
  get_new_slots_and_values((Am_Object *)&local_28,(Am_Value *)cmd,new_value);
  Am_Value::~Am_Value(&local_38);
  pAVar2 = Am_Object::Get(cmd,0xef,0);
  dir = Am_Value::operator_cast_to_int(pAVar2);
  internal_search_using(cmd,dir,&local_50,&local_48,&local_28);
  Am_Value_List::~Am_Value_List(&local_28);
  Am_Value_List::~Am_Value_List(&local_48);
  Am_Object::~Am_Object(&local_50);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void, find_repeat_new,
                 (Am_Object cmd, Am_Value new_sel, Am_Value new_value))
{
  Am_Object sel_widget = cmd.Get(Am_SELECTION_WIDGET);
  Am_Value_List old_sel_list;
  if (new_sel.Exists() && Am_Value_List::Test(new_sel))
    old_sel_list = new_sel;
  else
    old_sel_list = sel_widget.Get(Am_VALUE);
  Am_Value_List slots_and_values_used =
      get_new_slots_and_values(cmd, new_value, new_sel);
  Am_Which_Search_Direction dir =
      (Am_Which_Search_Direction)(int)cmd.Get(Am_CURRENT_DIRECTION);
  internal_search_using(cmd, dir, sel_widget, old_sel_list,
                        slots_and_values_used);
}